

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O3

int SSL_write(SSL *ssl,void *buf,int num)

{
  long lVar1;
  int iVar2;
  int line;
  bool needs_handshake;
  size_t bytes_written;
  char local_39;
  undefined8 local_38;
  
  *(undefined4 *)(ssl->handshake_func + 0xc4) = 0;
  ERR_clear_error();
  ERR_clear_system_error();
  if (ssl->msg_callback == (_func_3150 *)0x0) {
    lVar1._0_4_ = ssl->rwstate;
    lVar1._4_4_ = ssl->in_handshake;
    if (lVar1 != 0) {
      local_38 = 0;
      local_39 = '\0';
      do {
        if ((*(long *)(ssl->handshake_func + 0x118) != 0) &&
           ((*(ushort *)(*(long *)(ssl->handshake_func + 0x118) + 0x6c8) & 0x2008) == 0)) {
          iVar2 = SSL_do_handshake(ssl);
          if (iVar2 < 0) {
            return iVar2;
          }
          if (iVar2 == 0) {
            iVar2 = 0xd7;
            line = 0x3c6;
            goto LAB_0025a60e;
          }
        }
        if (num < 0) {
          iVar2 = 0x6f;
          line = 0x3cc;
          goto LAB_0025a60e;
        }
        iVar2 = (**(code **)(*(long *)ssl + 0x48))(ssl,&local_39,&local_38,buf,num);
        if (local_39 == '\0') {
          if (iVar2 < 1) {
            return iVar2;
          }
          return (int)local_38;
        }
      } while( true );
    }
    iVar2 = 0xe2;
    line = 0x3b7;
  }
  else {
    iVar2 = 0x42;
    line = 0x3b2;
  }
LAB_0025a60e:
  ERR_put_error(0x10,0,iVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                ,line);
  return -1;
}

Assistant:

int SSL_write(SSL *ssl, const void *buf, int num) {
  ssl_reset_error_state(ssl);

  if (SSL_is_quic(ssl)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return -1;
  }

  if (ssl->do_handshake == NULL) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNINITIALIZED);
    return -1;
  }

  int ret = 0;
  size_t bytes_written = 0;
  bool needs_handshake = false;
  do {
    // If necessary, complete the handshake implicitly.
    if (!ssl_can_write(ssl)) {
      ret = SSL_do_handshake(ssl);
      if (ret < 0) {
        return ret;
      }
      if (ret == 0) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_SSL_HANDSHAKE_FAILURE);
        return -1;
      }
    }

    if (num < 0) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_LENGTH);
      return -1;
    }
    ret = ssl->method->write_app_data(
        ssl, &needs_handshake, &bytes_written,
        Span(static_cast<const uint8_t *>(buf), static_cast<size_t>(num)));
  } while (needs_handshake);
  return ret <= 0 ? ret : static_cast<int>(bytes_written);
}